

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmrc.hpp
# Opt level: O1

file_or_directory * __thiscall
cmrc::embedded_filesystem::_get(embedded_filesystem *this,string *path)

{
  pointer pcVar1;
  const_iterator cVar2;
  file_or_directory *pfVar3;
  string local_60;
  string local_40;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + path->_M_string_length);
  detail::normalize_path(&local_40,&local_60);
  std::__cxx11::string::operator=((string *)path,(string *)&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_cmrc::detail::file_or_directory_*>_>_>
          ::find(&this->_index->_M_t,path);
  if ((_Rb_tree_header *)cVar2._M_node == &(this->_index->_M_t)._M_impl.super__Rb_tree_header) {
    pfVar3 = (file_or_directory *)0x0;
  }
  else {
    pfVar3 = *(file_or_directory **)(cVar2._M_node + 2);
  }
  return pfVar3;
}

Assistant:

const detail::file_or_directory* _get(std::string path) const {
        path = detail::normalize_path(path);
        auto found = _index->find(path);
        if (found == _index->end()) {
            return nullptr;
        } else {
            return found->second;
        }
    }